

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_panel_begin(nk_context *ctx,char *title,nk_panel_type panel_type)

{
  nk_rect *pnVar1;
  uint uVar2;
  nk_user_font *f;
  nk_window *pnVar3;
  nk_panel *pnVar4;
  nk_vec2 nVar5;
  nk_vec2 nVar6;
  nk_rect r;
  nk_rect r_00;
  nk_rect rect;
  nk_rect b;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect rect_00;
  nk_rect r_01;
  nk_rect rect_01;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  int iVar17;
  int iVar18;
  nk_style *style_00;
  nk_command_buffer *b_00;
  float fVar19;
  float fVar20;
  float fVar21;
  nk_rect nVar22;
  byte local_155;
  float local_154;
  float local_150;
  float local_14c;
  uint local_148;
  nk_symbol_type local_144;
  nk_context *local_130;
  undefined1 local_124 [8];
  nk_rect clip;
  nk_rect body;
  float t;
  nk_rect label;
  int text_len;
  nk_flags ws_1;
  nk_flags ws;
  nk_rect button;
  nk_style_item *background;
  nk_rect header_1;
  nk_text text;
  nk_rect header;
  int left_mouse_click_in_cursor;
  int left_mouse_clicked;
  int left_mouse_down;
  float local_68;
  float fStack_64;
  nk_vec2 panel_padding;
  nk_vec2 scrollbar_size;
  nk_user_font *font;
  nk_style *style;
  nk_command_buffer *out;
  nk_panel *layout;
  nk_window *win;
  nk_input *in;
  nk_panel_type panel_type_local;
  char *title_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3ca5,
                  "int nk_panel_begin(struct nk_context *, const char *, enum nk_panel_type)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3ca6,
                  "int nk_panel_begin(struct nk_context *, const char *, enum nk_panel_type)");
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3ca7,
                  "int nk_panel_begin(struct nk_context *, const char *, enum nk_panel_type)");
  }
  if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
     (ctx->current->layout == (nk_panel *)0x0)) {
    ctx_local._4_4_ = 0;
  }
  else {
    nk_zero(ctx->current->layout,0x1c0);
    if (((ctx->current->flags & 0x2000) == 0) && ((ctx->current->flags & 0x4000) == 0)) {
      style_00 = &ctx->style;
      f = style_00->font;
      pnVar3 = ctx->current;
      pnVar4 = pnVar3->layout;
      b_00 = &pnVar3->buffer;
      local_130 = ctx;
      if ((pnVar3->flags & 0x400) != 0) {
        local_130 = (nk_context *)0x0;
      }
      nVar5 = (ctx->style).window.scrollbar_size;
      nVar6 = nk_panel_get_padding(style_00,panel_type);
      fStack_64 = nVar6.y;
      if (((pnVar3->flags & 2) != 0) && ((pnVar3->flags & 0x1000) == 0)) {
        uVar7 = (pnVar3->bounds).x;
        uVar8 = (pnVar3->bounds).y;
        uVar9 = (pnVar3->bounds).w;
        nVar22.w = (float)uVar9;
        nVar22.y = (float)uVar8;
        nVar22.x = (float)uVar7;
        iVar17 = nk_panel_has_header(pnVar3->flags,title);
        if (iVar17 == 0) {
          header.y = fStack_64;
        }
        else {
          fVar19 = (ctx->style).window.header.padding.y;
          fVar21 = (ctx->style).window.header.label_padding.y;
          header.y = fVar21 + fVar21 + fVar19 + fVar19 + f->height;
        }
        iVar17 = (local_130->input).mouse.buttons[0].down;
        uVar2 = (local_130->input).mouse.buttons[0].clicked;
        nVar22.h = header.y;
        iVar18 = nk_input_has_mouse_click_down_in_rect(&local_130->input,NK_BUTTON_LEFT,nVar22,1);
        if (((iVar17 != 0) && (iVar18 != 0)) && (uVar2 == 0)) {
          (pnVar3->bounds).x = (pnVar3->bounds).x + (local_130->input).mouse.delta.x;
          (pnVar3->bounds).y = (pnVar3->bounds).y + (local_130->input).mouse.delta.y;
          (local_130->input).mouse.buttons[0].clicked_pos.x =
               (local_130->input).mouse.delta.x + (local_130->input).mouse.buttons[0].clicked_pos.x;
          (local_130->input).mouse.buttons[0].clicked_pos.y =
               (local_130->input).mouse.delta.y + (local_130->input).mouse.buttons[0].clicked_pos.y;
          (ctx->style).cursor_active = (ctx->style).cursors[2];
        }
      }
      pnVar4->type = panel_type;
      pnVar4->flags = pnVar3->flags;
      fVar19 = (pnVar3->bounds).y;
      (pnVar4->bounds).x = (pnVar3->bounds).x;
      (pnVar4->bounds).y = fVar19;
      fVar19 = (pnVar3->bounds).h;
      (pnVar4->bounds).w = (pnVar3->bounds).w;
      (pnVar4->bounds).h = fVar19;
      local_68 = nVar6.x;
      (pnVar4->bounds).x = local_68 + (pnVar4->bounds).x;
      (pnVar4->bounds).w = (pnVar4->bounds).w - (local_68 + local_68);
      if ((pnVar3->flags & 1) == 0) {
        pnVar4->border = 0.0;
      }
      else {
        fVar19 = nk_panel_get_border(style_00,pnVar3->flags,panel_type);
        pnVar4->border = fVar19;
        nVar22 = nk_shrink_rect(pnVar4->bounds,pnVar4->border);
        (pnVar4->bounds).x = (float)(int)nVar22._0_8_;
        (pnVar4->bounds).y = (float)(int)((ulong)nVar22._0_8_ >> 0x20);
        (pnVar4->bounds).w = (float)(int)nVar22._8_8_;
        (pnVar4->bounds).h = (float)(int)((ulong)nVar22._8_8_ >> 0x20);
      }
      pnVar4->at_y = (pnVar4->bounds).y;
      pnVar4->at_x = (pnVar4->bounds).x;
      pnVar4->max_x = 0.0;
      pnVar4->header_height = 0.0;
      pnVar4->footer_height = 0.0;
      nk_layout_reset_min_row_height(ctx);
      (pnVar4->row).index = 0;
      (pnVar4->row).columns = 0;
      (pnVar4->row).ratio = (float *)0x0;
      (pnVar4->row).item_width = 0.0;
      (pnVar4->row).tree_depth = 0;
      (pnVar4->row).height = fStack_64;
      pnVar4->has_scrolling = 1;
      if ((pnVar3->flags & 0x20) == 0) {
        panel_padding.x = nVar5.x;
        (pnVar4->bounds).w = (pnVar4->bounds).w - panel_padding.x;
      }
      iVar17 = nk_panel_is_nonblock(panel_type);
      if (iVar17 == 0) {
        pnVar4->footer_height = 0.0;
        if (((pnVar3->flags & 0x20) == 0) || ((pnVar3->flags & 4) != 0)) {
          panel_padding.y = nVar5.y;
          pnVar4->footer_height = panel_padding.y;
        }
        (pnVar4->bounds).h = (pnVar4->bounds).h - pnVar4->footer_height;
      }
      iVar17 = nk_panel_has_header(pnVar3->flags,title);
      if (iVar17 != 0) {
        stack0xffffffffffffff38 = (nk_style_window *)0x0;
        pnVar1 = &pnVar3->bounds;
        background._4_4_ = pnVar1->x;
        fVar19 = (pnVar3->bounds).y;
        uVar15 = pnVar1->x;
        uVar16 = pnVar1->y;
        rect_01.y = (float)uVar16;
        rect_01.x = (float)uVar15;
        uVar13 = pnVar1->x;
        uVar14 = pnVar1->y;
        r_01.y = (float)uVar14;
        r_01.x = (float)uVar13;
        header_1.x = (pnVar3->bounds).w;
        uVar10 = pnVar1->x;
        uVar11 = pnVar1->y;
        uVar12 = pnVar1->w;
        rect_00.w = (float)uVar12;
        rect_00.y = (float)uVar11;
        rect_00.x = (float)uVar10;
        fVar21 = (ctx->style).window.header.padding.y;
        fVar20 = (ctx->style).window.header.label_padding.y;
        header_1.y = fVar20 + fVar20 + fVar21 + fVar21 + f->height;
        pnVar4->header_height = header_1.y;
        (pnVar4->bounds).y = header_1.y + (pnVar4->bounds).y;
        (pnVar4->bounds).h = (pnVar4->bounds).h - header_1.y;
        pnVar4->at_y = header_1.y + pnVar4->at_y;
        if (ctx->active == pnVar3) {
          register0x00000000 = (nk_style_window *)&(ctx->style).window.header.active;
        }
        else {
          rect_00.h = header_1.y;
          iVar17 = nk_input_is_mouse_hovering_rect(&ctx->input,rect_00);
          if (iVar17 == 0) {
            register0x00000000 = &(ctx->style).window;
          }
          else {
            register0x00000000 = (nk_style_window *)&(ctx->style).window.header.hover;
          }
        }
        header_1.y = header_1.y + 1.0;
        if ((stack0xffffffffffffff38->header).normal.type == NK_STYLE_ITEM_IMAGE) {
          button.w = (float)nk_rgba(0,0,0,0);
          r_01.w = header_1.x;
          r_01.h = header_1.y;
          nk_draw_image(&pnVar3->buffer,r_01,&(stack0xffffffffffffff38->header).normal.data.image,
                        (nk_color)0xffffffff);
        }
        else {
          rect_01.w = header_1.x;
          rect_01.h = header_1.y;
          nk_fill_rect(b_00,rect_01,0.0,(stack0xffffffffffffff38->header).normal.data.color);
        }
        ws = (nk_flags)(fVar19 + (ctx->style).window.header.padding.y);
        fVar21 = (ctx->style).window.header.padding.y;
        button.x = header_1.y - (fVar21 + fVar21);
        button.y = button.x;
        if ((pnVar3->flags & 8) != 0) {
          text_len = 0;
          if ((ctx->style).window.header.align == NK_HEADER_RIGHT) {
            ws_1 = (nk_flags)
                   ((header_1.x + background._4_4_) -
                   (button.x + (ctx->style).window.header.padding.x));
            header_1.x = header_1.x -
                         (button.x + (ctx->style).window.header.spacing.x +
                         (ctx->style).window.header.padding.x);
          }
          else {
            ws_1 = (nk_flags)(background._4_4_ + (ctx->style).window.header.padding.x);
            background._4_4_ =
                 button.x + (ctx->style).window.header.spacing.x +
                 (ctx->style).window.header.padding.x + background._4_4_;
          }
          bounds.y = (float)ws;
          bounds.x = (float)ws_1;
          bounds.w = button.x;
          bounds.h = button.x;
          iVar17 = nk_do_button_symbol((nk_flags *)&text_len,&pnVar3->buffer,bounds,
                                       (ctx->style).window.header.close_symbol,NK_BUTTON_DEFAULT,
                                       &(ctx->style).window.header.close_button,&local_130->input,
                                       style_00->font);
          if ((iVar17 != 0) && ((pnVar3->flags & 0x1000) == 0)) {
            pnVar4->flags = pnVar4->flags | 0x2000;
            pnVar4->flags = pnVar4->flags & 0xffff7fff;
          }
        }
        if ((pnVar3->flags & 0x10) != 0) {
          label.h = 0.0;
          if ((ctx->style).window.header.align == NK_HEADER_RIGHT) {
            ws_1 = (nk_flags)((header_1.x + background._4_4_) - button.x);
            if ((pnVar3->flags & 8) == 0) {
              ws_1 = (nk_flags)((float)ws_1 - (ctx->style).window.header.padding.x);
              header_1.x = header_1.x - (ctx->style).window.header.padding.x;
            }
            header_1.x = header_1.x - (button.x + (ctx->style).window.header.spacing.x);
          }
          else {
            ws_1 = (nk_flags)background._4_4_;
            background._4_4_ =
                 button.x + (ctx->style).window.header.spacing.x +
                 (ctx->style).window.header.padding.x + background._4_4_;
          }
          if ((pnVar4->flags & 0x8000) == 0) {
            local_144 = (ctx->style).window.header.minimize_symbol;
          }
          else {
            local_144 = (ctx->style).window.header.maximize_symbol;
          }
          bounds_00.y = (float)ws;
          bounds_00.x = (float)ws_1;
          bounds_00.w = button.x;
          bounds_00.h = button.y;
          iVar17 = nk_do_button_symbol((nk_flags *)&label.h,&pnVar3->buffer,bounds_00,local_144,
                                       NK_BUTTON_DEFAULT,&(ctx->style).window.header.minimize_button
                                       ,&local_130->input,style_00->font);
          if ((iVar17 != 0) && ((pnVar3->flags & 0x1000) == 0)) {
            if ((pnVar4->flags & 0x8000) == 0) {
              local_148 = pnVar4->flags | 0x8000;
            }
            else {
              local_148 = pnVar4->flags & 0xffff7fff;
            }
            pnVar4->flags = local_148;
          }
        }
        label.w = (float)nk_strlen(title);
        label.x = 0.0;
        label.y = 0.0;
        local_154 = (*f->width)(f->userdata,f->height,title,(int)label.w);
        header_1._8_8_ = nk_vec2(0.0,0.0);
        fVar20 = (ctx->style).window.header.label_padding.x +
                 background._4_4_ + (ctx->style).window.header.padding.x;
        fVar21 = (ctx->style).window.header.label_padding.y;
        label.y = fVar21 + fVar21 + f->height;
        fVar21 = (ctx->style).window.header.spacing.x;
        local_154 = fVar21 + fVar21 + local_154;
        local_14c = local_154;
        if ((background._4_4_ + header_1.x) - fVar20 <= local_154) {
          local_14c = (background._4_4_ + header_1.x) - fVar20;
        }
        if (0.0 <= local_14c) {
          if ((background._4_4_ + header_1.x) - fVar20 <= local_154) {
            local_154 = (background._4_4_ + header_1.x) - fVar20;
          }
          local_150 = local_154;
        }
        else {
          local_150 = 0.0;
        }
        label.x = local_150;
        b.y = fVar19 + (ctx->style).window.header.label_padding.y;
        b.x = fVar20;
        b.w = local_150;
        b.h = label.y;
        nk_widget_text(b_00,b,title,(int)label.w,(nk_text *)&header_1.w,0x11,f);
      }
      if (((pnVar4->flags & 0x8000) == 0) && ((pnVar4->flags & 0x800) == 0)) {
        clip.w = (pnVar3->bounds).x;
        fVar19 = (pnVar3->bounds).w;
        clip.h = (pnVar3->bounds).y + pnVar4->header_height;
        fVar21 = (pnVar3->bounds).h - pnVar4->header_height;
        if ((ctx->style).window.fixed_background.type == NK_STYLE_ITEM_IMAGE) {
          r_00.y = clip.h;
          r_00.x = clip.w;
          r_00.w = fVar19;
          r_00.h = fVar21;
          nk_draw_image(b_00,r_00,&(ctx->style).window.fixed_background.data.image,
                        (nk_color)0xffffffff);
        }
        else {
          rect.y = clip.h;
          rect.x = clip.w;
          rect.w = fVar19;
          rect.h = fVar21;
          nk_fill_rect(b_00,rect,0.0,(ctx->style).window.fixed_background.data.color);
        }
      }
      fVar19 = (pnVar4->bounds).y;
      fVar21 = (pnVar4->bounds).w;
      fVar20 = (pnVar4->bounds).h;
      (pnVar4->clip).x = (pnVar4->bounds).x;
      (pnVar4->clip).y = fVar19;
      (pnVar4->clip).w = fVar21;
      (pnVar4->clip).h = fVar20;
      fVar19 = (pnVar4->clip).x;
      fVar21 = (pnVar4->clip).y;
      nk_unify((nk_rect *)local_124,&(pnVar3->buffer).clip,fVar19,fVar21,fVar19 + (pnVar4->clip).w,
               fVar21 + (pnVar4->clip).h);
      r.w = clip.x;
      r.h = clip.y;
      r.x = (float)local_124._0_4_;
      r.y = (float)local_124._4_4_;
      nk_push_scissor(b_00,r);
      (pnVar4->clip).x = (float)local_124._0_4_;
      (pnVar4->clip).y = (float)local_124._4_4_;
      (pnVar4->clip).w = clip.x;
      (pnVar4->clip).h = clip.y;
      local_155 = 0;
      if ((pnVar4->flags & 0x2000) == 0) {
        local_155 = (pnVar4->flags & 0x8000) != 0 ^ 0xff;
      }
      ctx_local._4_4_ = (uint)(local_155 & 1);
    }
    else {
      nk_zero(ctx->current->layout,0x1c0);
      ctx->current->layout->type = panel_type;
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

NK_LIB int
nk_panel_begin(struct nk_context *ctx, const char *title, enum nk_panel_type panel_type)
{
    struct nk_input *in;
    struct nk_window *win;
    struct nk_panel *layout;
    struct nk_command_buffer *out;
    const struct nk_style *style;
    const struct nk_user_font *font;

    struct nk_vec2 scrollbar_size;
    struct nk_vec2 panel_padding;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout) return 0;
    nk_zero(ctx->current->layout, sizeof(*ctx->current->layout));
    if ((ctx->current->flags & NK_WINDOW_HIDDEN) || (ctx->current->flags & NK_WINDOW_CLOSED)) {
        nk_zero(ctx->current->layout, sizeof(struct nk_panel));
        ctx->current->layout->type = panel_type;
        return 0;
    }
    /* pull state into local stack */
    style = &ctx->style;
    font = style->font;
    win = ctx->current;
    layout = win->layout;
    out = &win->buffer;
    in = (win->flags & NK_WINDOW_NO_INPUT) ? 0: &ctx->input;
#ifdef NK_INCLUDE_COMMAND_USERDATA
    win->buffer.userdata = ctx->userdata;
#endif
    /* pull style configuration into local stack */
    scrollbar_size = style->window.scrollbar_size;
    panel_padding = nk_panel_get_padding(style, panel_type);

    /* window movement */
    if ((win->flags & NK_WINDOW_MOVABLE) && !(win->flags & NK_WINDOW_ROM)) {
        int left_mouse_down;
        int left_mouse_clicked;
        int left_mouse_click_in_cursor;

        /* calculate draggable window space */
        struct nk_rect header;
        header.x = win->bounds.x;
        header.y = win->bounds.y;
        header.w = win->bounds.w;
        if (nk_panel_has_header(win->flags, title)) {
            header.h = font->height + 2.0f * style->window.header.padding.y;
            header.h += 2.0f * style->window.header.label_padding.y;
        } else header.h = panel_padding.y;

        /* window movement by dragging */
        left_mouse_down = in->mouse.buttons[NK_BUTTON_LEFT].down;
        left_mouse_clicked = (int)in->mouse.buttons[NK_BUTTON_LEFT].clicked;
        left_mouse_click_in_cursor = nk_input_has_mouse_click_down_in_rect(in,
            NK_BUTTON_LEFT, header, nk_true);
        if (left_mouse_down && left_mouse_click_in_cursor && !left_mouse_clicked) {
            win->bounds.x = win->bounds.x + in->mouse.delta.x;
            win->bounds.y = win->bounds.y + in->mouse.delta.y;
            in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.x += in->mouse.delta.x;
            in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.y += in->mouse.delta.y;
            ctx->style.cursor_active = ctx->style.cursors[NK_CURSOR_MOVE];
        }
    }

    /* setup panel */
    layout->type = panel_type;
    layout->flags = win->flags;
    layout->bounds = win->bounds;
    layout->bounds.x += panel_padding.x;
    layout->bounds.w -= 2*panel_padding.x;
    if (win->flags & NK_WINDOW_BORDER) {
        layout->border = nk_panel_get_border(style, win->flags, panel_type);
        layout->bounds = nk_shrink_rect(layout->bounds, layout->border);
    } else layout->border = 0;
    layout->at_y = layout->bounds.y;
    layout->at_x = layout->bounds.x;
    layout->max_x = 0;
    layout->header_height = 0;
    layout->footer_height = 0;
    nk_layout_reset_min_row_height(ctx);
    layout->row.index = 0;
    layout->row.columns = 0;
    layout->row.ratio = 0;
    layout->row.item_width = 0;
    layout->row.tree_depth = 0;
    layout->row.height = panel_padding.y;
    layout->has_scrolling = nk_true;
    if (!(win->flags & NK_WINDOW_NO_SCROLLBAR))
        layout->bounds.w -= scrollbar_size.x;
    if (!nk_panel_is_nonblock(panel_type)) {
        layout->footer_height = 0;
        if (!(win->flags & NK_WINDOW_NO_SCROLLBAR) || win->flags & NK_WINDOW_SCALABLE)
            layout->footer_height = scrollbar_size.y;
        layout->bounds.h -= layout->footer_height;
    }

    /* panel header */
    if (nk_panel_has_header(win->flags, title))
    {
        struct nk_text text;
        struct nk_rect header;
        const struct nk_style_item *background = 0;

        /* calculate header bounds */
        header.x = win->bounds.x;
        header.y = win->bounds.y;
        header.w = win->bounds.w;
        header.h = font->height + 2.0f * style->window.header.padding.y;
        header.h += (2.0f * style->window.header.label_padding.y);

        /* shrink panel by header */
        layout->header_height = header.h;
        layout->bounds.y += header.h;
        layout->bounds.h -= header.h;
        layout->at_y += header.h;

        /* select correct header background and text color */
        if (ctx->active == win) {
            background = &style->window.header.active;
            text.text = style->window.header.label_active;
        } else if (nk_input_is_mouse_hovering_rect(&ctx->input, header)) {
            background = &style->window.header.hover;
            text.text = style->window.header.label_hover;
        } else {
            background = &style->window.header.normal;
            text.text = style->window.header.label_normal;
        }

        /* draw header background */
        header.h += 1.0f;
        if (background->type == NK_STYLE_ITEM_IMAGE) {
            text.background = nk_rgba(0,0,0,0);
            nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
        } else {
            text.background = background->data.color;
            nk_fill_rect(out, header, 0, background->data.color);
        }

        /* window close button */
        {struct nk_rect button;
        button.y = header.y + style->window.header.padding.y;
        button.h = header.h - 2 * style->window.header.padding.y;
        button.w = button.h;
        if (win->flags & NK_WINDOW_CLOSABLE) {
            nk_flags ws = 0;
            if (style->window.header.align == NK_HEADER_RIGHT) {
                button.x = (header.w + header.x) - (button.w + style->window.header.padding.x);
                header.w -= button.w + style->window.header.spacing.x + style->window.header.padding.x;
            } else {
                button.x = header.x + style->window.header.padding.x;
                header.x += button.w + style->window.header.spacing.x + style->window.header.padding.x;
            }

            if (nk_do_button_symbol(&ws, &win->buffer, button,
                style->window.header.close_symbol, NK_BUTTON_DEFAULT,
                &style->window.header.close_button, in, style->font) && !(win->flags & NK_WINDOW_ROM))
            {
                layout->flags |= NK_WINDOW_HIDDEN;
                layout->flags &= (nk_flags)~NK_WINDOW_MINIMIZED;
            }
        }

        /* window minimize button */
        if (win->flags & NK_WINDOW_MINIMIZABLE) {
            nk_flags ws = 0;
            if (style->window.header.align == NK_HEADER_RIGHT) {
                button.x = (header.w + header.x) - button.w;
                if (!(win->flags & NK_WINDOW_CLOSABLE)) {
                    button.x -= style->window.header.padding.x;
                    header.w -= style->window.header.padding.x;
                }
                header.w -= button.w + style->window.header.spacing.x;
            } else {
                button.x = header.x;
                header.x += button.w + style->window.header.spacing.x + style->window.header.padding.x;
            }
            if (nk_do_button_symbol(&ws, &win->buffer, button, (layout->flags & NK_WINDOW_MINIMIZED)?
                style->window.header.maximize_symbol: style->window.header.minimize_symbol,
                NK_BUTTON_DEFAULT, &style->window.header.minimize_button, in, style->font) && !(win->flags & NK_WINDOW_ROM))
                layout->flags = (layout->flags & NK_WINDOW_MINIMIZED) ?
                    layout->flags & (nk_flags)~NK_WINDOW_MINIMIZED:
                    layout->flags | NK_WINDOW_MINIMIZED;
        }}

        {/* window header title */
        int text_len = nk_strlen(title);
        struct nk_rect label = {0,0,0,0};
        float t = font->width(font->userdata, font->height, title, text_len);
        text.padding = nk_vec2(0,0);

        label.x = header.x + style->window.header.padding.x;
        label.x += style->window.header.label_padding.x;
        label.y = header.y + style->window.header.label_padding.y;
        label.h = font->height + 2 * style->window.header.label_padding.y;
        label.w = t + 2 * style->window.header.spacing.x;
        label.w = NK_CLAMP(0, label.w, header.x + header.w - label.x);
        nk_widget_text(out, label,(const char*)title, text_len, &text, NK_TEXT_LEFT, font);}
    }

    /* draw window background */
    if (!(layout->flags & NK_WINDOW_MINIMIZED) && !(layout->flags & NK_WINDOW_DYNAMIC)) {
        struct nk_rect body;
        body.x = win->bounds.x;
        body.w = win->bounds.w;
        body.y = (win->bounds.y + layout->header_height);
        body.h = (win->bounds.h - layout->header_height);
        if (style->window.fixed_background.type == NK_STYLE_ITEM_IMAGE)
            nk_draw_image(out, body, &style->window.fixed_background.data.image, nk_white);
        else nk_fill_rect(out, body, 0, style->window.fixed_background.data.color);
    }

    /* set clipping rectangle */
    {struct nk_rect clip;
    layout->clip = layout->bounds;
    nk_unify(&clip, &win->buffer.clip, layout->clip.x, layout->clip.y,
        layout->clip.x + layout->clip.w, layout->clip.y + layout->clip.h);
    nk_push_scissor(out, clip);
    layout->clip = clip;}
    return !(layout->flags & NK_WINDOW_HIDDEN) && !(layout->flags & NK_WINDOW_MINIMIZED);
}